

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall
wasm_foreign_t::wasm_foreign_t(wasm_foreign_t *this,RefPtr<wabt::interp::Foreign> *ptr)

{
  RefPtr<wabt::interp::Object> local_30;
  RefPtr<wabt::interp::Foreign> *local_18;
  RefPtr<wabt::interp::Foreign> *ptr_local;
  wasm_foreign_t *this_local;
  
  local_18 = ptr;
  ptr_local = (RefPtr<wabt::interp::Foreign> *)this;
  wabt::interp::RefPtr<wabt::interp::Object>::RefPtr<wabt::interp::Foreign>(&local_30,ptr);
  wasm_ref_t::wasm_ref_t(&this->super_wasm_ref_t,&local_30);
  wabt::interp::RefPtr<wabt::interp::Object>::~RefPtr(&local_30);
  return;
}

Assistant:

wasm_foreign_t(RefPtr<Foreign> ptr) : wasm_ref_t(ptr) {}